

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall
kratos::Enum::add_debug_info
          (Enum *this,string *enum_name,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *debug)

{
  __shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined1 local_28 [8];
  mapped_type var;
  
  p_Var1 = &std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>_>_>_>
            ::at(&this->values,enum_name)->
            super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2> *)local_28,p_Var1);
  std::
  vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
  ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>const&>
            ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
              *)&(((Const *)local_28)->super_Var).super_IRNode.fn_name_ln,debug);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var);
  return;
}

Assistant:

void Enum::add_debug_info(const std::string &enum_name,
                          const std::pair<std::string, uint32_t> &debug) {
    auto var = values.at(enum_name);
    var->fn_name_ln.emplace_back(debug);
}